

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

void __thiscall ON_SubDMeshImpl::ON_SubDMeshImpl(ON_SubDMeshImpl *this,bool has_curvatures)

{
  ON__UINT64 OVar1;
  
  this->m_mesh_content_serial_number = 0;
  this->m_absolute_subd_display_density = 0;
  this->m_fragment_count = 0;
  this->m_fragment_point_count = 0;
  this->m_first_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_last_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_has_curvatures = has_curvatures;
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  (this->m_subdimple_wp).super___weak_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_subdimple_wp).super___weak_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_fragment_tree = (ON_RTree *)0x0;
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fsp);
  OVar1 = ON_NextContentSerialNumber();
  this->m_mesh_content_serial_number = OVar1;
  return;
}

Assistant:

ON_SubDMeshImpl::ON_SubDMeshImpl(const bool has_curvatures)
    : m_has_curvatures(has_curvatures)
{
  ChangeContentSerialNumber();
}